

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-execution.h
# Opt level: O1

void wasm::
     LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
     ::scan(SimplifyLocals<false,_false,_false> *self,Expression **currp)

{
  Id IVar1;
  Expression *pEVar2;
  char *__function;
  Expression *pEVar3;
  LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
  *pLVar4;
  code *pcVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  _func_void_SimplifyLocals<false,_false,_false>_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar2 = *currp;
  IVar1 = pEVar2->_id;
  if ((int)IVar1 < 0x13) {
    switch(IVar1) {
    case InvalidId:
      handle_unreachable("bad id",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/linear-execution.h"
                         ,0x34);
    case BlockId:
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ;
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,
                 Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 ::doVisitBlock,currp);
      if (pEVar2->_id == BlockId) {
        if (pEVar2[1].type.id != 0) {
          Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
          ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                      *)pLVar4,SimplifyLocals<false,_false,_false>::doNoteNonLinear,currp);
        }
        if (pEVar2->_id == BlockId) {
          uVar6 = (uint)pEVar2[2].type.id;
          if ((int)uVar6 < 1) {
            return;
          }
          uVar7 = (ulong)(uVar6 & 0x7fffffff);
          lVar9 = uVar7 * 8;
          lVar8 = uVar7 + 1;
          while (lVar9 = lVar9 + -8, lVar8 - 2U < pEVar2[2].type.id) {
            Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
            ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                        *)pLVar4,SimplifyLocals<false,_false,_false>::scan,
                       (Expression **)(*(long *)(pEVar2 + 2) + lVar9));
            lVar8 = lVar8 + -1;
            if (lVar8 < 2) {
              return;
            }
          }
LAB_0091fd0a:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
      }
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
      break;
    case IfId:
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ;
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,
                 Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 ::doVisitIf,currp);
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,SimplifyLocals<false,_false,_false>::doNoteNonLinear,currp);
      if (pEVar2->_id == IfId) {
        local_38 = pEVar2 + 2;
        local_40 = SimplifyLocals<false,_false,_false>::scan;
        if (*(long *)(pEVar2 + 2) != 0) {
          SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,false>,wasm::Visitor<wasm::SimplifyLocals<false,false,false>,void>>::Task,10ul>
          ::
          emplace_back<void(*&)(wasm::SimplifyLocals<false,false,false>*,wasm::Expression**),wasm::Expression**&>
                    ((SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,false>,wasm::Visitor<wasm::SimplifyLocals<false,false,false>,void>>::Task,10ul>
                      *)&(self->
                         super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                         ).
                         super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                         .
                         super_PostWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                         .
                         super_Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                         .stack,&local_40,(Expression ***)&local_38);
        }
        Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
        ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                    *)pLVar4,SimplifyLocals<false,_false,_false>::doNoteNonLinear,currp);
        if (pEVar2->_id == IfId) {
          Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
          ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                      *)pLVar4,SimplifyLocals<false,_false,_false>::scan,
                     (Expression **)&pEVar2[1].type);
          Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
          ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                      *)pLVar4,SimplifyLocals<false,_false,_false>::doNoteNonLinear,currp);
          if (pEVar2->_id == IfId) {
            Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
            ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                        *)pLVar4,SimplifyLocals<false,_false,_false>::scan,
                       (Expression **)(pEVar2 + 1));
            return;
          }
        }
      }
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      break;
    case LoopId:
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)&(self->
                     super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                     ).
                     super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 ,Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  ::doVisitLoop,currp);
      if (pEVar2->_id != LoopId) {
        __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
        break;
      }
      pcVar5 = SimplifyLocals<false,_false,_false>::scan;
      pEVar3 = pEVar2 + 2;
      goto LAB_0091fbd9;
    case BreakId:
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ;
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,
                 Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 ::doVisitBreak,currp);
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,SimplifyLocals<false,_false,_false>::doNoteNonLinear,currp);
      if (pEVar2->_id == BreakId) {
        local_38 = (Expression *)&pEVar2[2].type;
        local_40 = SimplifyLocals<false,_false,_false>::scan;
        if (pEVar2[2].type.id != 0) {
          SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,false>,wasm::Visitor<wasm::SimplifyLocals<false,false,false>,void>>::Task,10ul>
          ::
          emplace_back<void(*&)(wasm::SimplifyLocals<false,false,false>*,wasm::Expression**),wasm::Expression**&>
                    ((SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,false>,wasm::Visitor<wasm::SimplifyLocals<false,false,false>,void>>::Task,10ul>
                      *)&(self->
                         super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                         ).
                         super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                         .
                         super_PostWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                         .
                         super_Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                         .stack,&local_40,(Expression ***)&local_38);
        }
        if (pEVar2->_id == BreakId) {
          local_38 = pEVar2 + 2;
          lVar9 = *(long *)(pEVar2 + 2);
          goto joined_r0x0091fb9d;
        }
      }
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      break;
    case SwitchId:
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ;
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,
                 Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 ::doVisitSwitch,currp);
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,SimplifyLocals<false,_false,_false>::doNoteNonLinear,currp);
      if ((pEVar2->_id == SwitchId) &&
         (Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
          ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                      *)pLVar4,SimplifyLocals<false,_false,_false>::scan,
                     (Expression **)&pEVar2[4].type), pEVar2->_id == SwitchId)) {
        local_38 = pEVar2 + 4;
        lVar9 = *(long *)(pEVar2 + 4);
joined_r0x0091fb9d:
        if (lVar9 != 0) {
          local_40 = SimplifyLocals<false,_false,_false>::scan;
          SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,false>,wasm::Visitor<wasm::SimplifyLocals<false,false,false>,void>>::Task,10ul>
          ::
          emplace_back<void(*&)(wasm::SimplifyLocals<false,false,false>*,wasm::Expression**),wasm::Expression**&>
                    ((SmallVector<wasm::Walker<wasm::SimplifyLocals<false,false,false>,wasm::Visitor<wasm::SimplifyLocals<false,false,false>,void>>::Task,10ul>
                      *)&(self->
                         super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                         ).
                         super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                         .
                         super_PostWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                         .
                         super_Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                         .stack,&local_40,(Expression ***)&local_38);
        }
        return;
      }
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      break;
    default:
switchD_0091f8cd_default:
      PostWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::scan(self,currp);
      return;
    }
LAB_0091fe1a:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,__function);
  }
  pEVar3 = (Expression *)currp;
  if ((int)IVar1 < 0x32) {
    if (IVar1 == ReturnId) {
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ;
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,
                 Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 ::doVisitReturn,currp);
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,SimplifyLocals<false,_false,_false>::doNoteNonLinear,currp);
      if (pEVar2->_id == ReturnId) {
        local_38 = pEVar2 + 1;
        lVar9 = *(long *)(pEVar2 + 1);
        goto joined_r0x0091fb9d;
      }
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_0091fe1a;
    }
    if (IVar1 != UnreachableId) {
      if (IVar1 != TryId) goto switchD_0091f8cd_default;
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ;
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,
                 Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 ::doVisitTry,currp);
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,SimplifyLocals<false,_false,_false>::doNoteNonLinear,currp);
      if (pEVar2->_id == TryId) {
        if (0 < (int)(uint)*(undefined8 *)(pEVar2 + 5)) {
          uVar7 = (ulong)((uint)*(undefined8 *)(pEVar2 + 5) & 0x7fffffff);
          lVar9 = uVar7 * 8;
          lVar8 = uVar7 + 1;
          do {
            lVar9 = lVar9 + -8;
            if (*(ulong *)(pEVar2 + 5) <= lVar8 - 2U) goto LAB_0091fd0a;
            Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
            ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                        *)pLVar4,SimplifyLocals<false,_false,_false>::scan,
                       (Expression **)(pEVar2[4].type.id + lVar9));
            Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
            ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                        *)pLVar4,SimplifyLocals<false,_false,_false>::doNoteNonLinear,currp);
            lVar8 = lVar8 + -1;
          } while (1 < lVar8);
        }
        if (pEVar2->_id == TryId) {
          currp = (Expression **)(pEVar2 + 2);
          goto LAB_0091f9bc;
        }
      }
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_0091fe1a;
    }
    pcVar5 = Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
             ::doVisitUnreachable;
  }
  else {
    if (IVar1 == ThrowId) {
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ;
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,
                 Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 ::doVisitThrow,currp);
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,SimplifyLocals<false,_false,_false>::doNoteNonLinear,currp);
      if (pEVar2->_id == ThrowId) {
        uVar6 = (uint)pEVar2[2].type.id;
        if ((int)uVar6 < 1) {
          return;
        }
        uVar7 = (ulong)(uVar6 & 0x7fffffff);
        lVar9 = uVar7 * 8;
        lVar8 = uVar7 + 1;
        while (lVar9 = lVar9 + -8, lVar8 - 2U < pEVar2[2].type.id) {
          Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
          ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                      *)pLVar4,SimplifyLocals<false,_false,_false>::scan,
                     (Expression **)(*(long *)(pEVar2 + 2) + lVar9));
          lVar8 = lVar8 + -1;
          if (lVar8 < 2) {
            return;
          }
        }
        goto LAB_0091fd0a;
      }
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_0091fe1a;
    }
    if (IVar1 != RethrowId) {
      if (IVar1 != BrOnId) goto switchD_0091f8cd_default;
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ;
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,
                 Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 ::doVisitBrOn,currp);
      Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                  *)pLVar4,SimplifyLocals<false,_false,_false>::doNoteNonLinear,currp);
      if (pEVar2->_id != BrOnId) {
        __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
        goto LAB_0091fe1a;
      }
      currp = (Expression **)&pEVar2[2].type;
LAB_0091f9bc:
      pcVar5 = SimplifyLocals<false,_false,_false>::scan;
      goto LAB_0091fbeb;
    }
    pcVar5 = Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
             ::doVisitRethrow;
  }
LAB_0091fbd9:
  Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
  ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
              *)&(self->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                 ).
                 super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
             ,pcVar5,(Expression **)pEVar3);
  pcVar5 = SimplifyLocals<false,_false,_false>::doNoteNonLinear;
LAB_0091fbeb:
  Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
  ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
              *)&(self->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                 ).
                 super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
             ,pcVar5,currp);
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

    switch (curr->_id) {
      case Expression::Id::InvalidId:
        WASM_UNREACHABLE("bad id");
      case Expression::Id::BlockId: {
        self->pushTask(SubType::doVisitBlock, currp);
        if (curr->cast<Block>()->name.is()) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        auto& list = curr->cast<Block>()->list;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
        }
        break;
      }
      case Expression::Id::IfId: {
        self->pushTask(SubType::doVisitIf, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<If>()->ifFalse);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<If>()->ifTrue);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<If>()->condition);
        break;
      }
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doVisitLoop, currp);
        self->pushTask(SubType::scan, &curr->cast<Loop>()->body);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::BreakId: {
        self->pushTask(SubType::doVisitBreak, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<Break>()->condition);
        self->maybePushTask(SubType::scan, &curr->cast<Break>()->value);
        break;
      }
      case Expression::Id::SwitchId: {
        self->pushTask(SubType::doVisitSwitch, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<Switch>()->condition);
        self->maybePushTask(SubType::scan, &curr->cast<Switch>()->value);
        break;
      }
      case Expression::Id::ReturnId: {
        self->pushTask(SubType::doVisitReturn, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<Return>()->value);
        break;
      }
      case Expression::Id::TryId: {
        self->pushTask(SubType::doVisitTry, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        auto& list = curr->cast<Try>()->catchBodies;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<Try>()->body);
        break;
      }
      case Expression::Id::ThrowId: {
        self->pushTask(SubType::doVisitThrow, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        auto& list = curr->cast<Throw>()->operands;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
        }
        break;
      }
      case Expression::Id::RethrowId: {
        self->pushTask(SubType::doVisitRethrow, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::UnreachableId: {
        self->pushTask(SubType::doVisitUnreachable, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::BrOnId: {
        self->pushTask(SubType::doVisitBrOn, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<BrOn>()->ref);
        break;
      }
      default: {
        // All relevant things should have been handled.
        assert(!Properties::isControlFlowStructure(curr));
        assert(!Properties::isBranch(curr));
        // other node types do not have control flow, use regular post-order
        PostWalker<SubType, VisitorType>::scan(self, currp);
      }
    }
  }